

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O2

void Eigen::internal::
     assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>,_10,_16>
     ::run(Matrix<double,_4,_4,_0,_4,_4> *dst,
          CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>
          *src)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (((src->m_rhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[2];
  dVar2 = (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[3];
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10] =
       dVar1 * (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
               m_data.array[2];
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb] =
       dVar1 * dVar2;
  assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>,_12,_16>
  ::run(dst,src);
  return;
}

Assistant:

EIGEN_STRONG_INLINE const PacketScalar packet(Index row, Index col) const
    {
      PacketScalar res;
      internal::product_packet_impl<Flags&RowMajorBit ? RowMajor : ColMajor,
                              Unroll ? InnerSize : Dynamic,
                              _LhsNested, _RhsNested, PacketScalar, LoadMode>
        ::run(row, col, m_lhs, m_rhs, res);
      return res;
    }